

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_solveRealLPAndRecordStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool *interrupt)

{
  type_conflict5 tVar1;
  int iVar2;
  int iVar3;
  Representation RVar4;
  Type TVar5;
  element_type *peVar6;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Real RVar7;
  Real RVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  Verbosity old_verbosity_1;
  SPxException *E;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mintol;
  bool _hadBasis;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined1 in_stack_000028ff;
  bool *in_stack_00002900;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00002908;
  undefined4 in_stack_fffffffffffffab8;
  Representation in_stack_fffffffffffffabc;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  undefined4 in_stack_fffffffffffffac8;
  Type in_stack_fffffffffffffacc;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffad0;
  self_type *in_stack_fffffffffffffad8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffae0;
  Real local_340;
  undefined1 local_338 [80];
  Real local_2e8;
  undefined1 local_2e0 [80];
  Real local_290;
  undefined1 local_288 [80];
  Real local_238;
  undefined1 local_230 [112];
  Real local_1c0;
  Real local_188;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  undefined8 local_130;
  undefined1 local_124 [83];
  byte local_d1;
  undefined8 local_c0;
  Real *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  Real *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  Real *local_88;
  undefined1 *local_80;
  undefined8 local_78;
  Real *local_70;
  undefined1 *local_68;
  Real *local_60;
  Real *local_58;
  Real *local_50;
  Real *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_d1 = in_RDI->_hasBasis & 1;
  iVar2 = intParam(in_RDI,ITERLIMIT);
  RVar7 = realParam(in_RDI,INFTY);
  if (RVar7 <= (double)iVar2) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTerminationIter(&in_RDI->_solver,-1);
  }
  else {
    iVar2 = intParam(in_RDI,ITERLIMIT);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTerminationIter(&in_RDI->_solver,iVar2 - in_RDI->_statistics->iterations);
  }
  RVar7 = realParam(in_RDI,TIMELIMIT);
  RVar8 = realParam(in_RDI,INFTY);
  if (RVar8 <= RVar7) {
    RVar7 = realParam(in_RDI,INFTY);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTerminationTime(&in_RDI->_solver,RVar7);
  }
  else {
    RVar7 = realParam(in_RDI,TIMELIMIT);
    (*in_RDI->_statistics->solvingTime->_vptr_Timer[6])();
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTerminationTime(&in_RDI->_solver,RVar7 - extraout_XMM0_Qa);
  }
  local_130 = 0x40c3880000000000;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  local_30 = &local_130;
  local_38 = &local_180;
  local_28 = local_124;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,&local_180);
  local_20 = local_124;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  local_18 = local_38;
  local_8 = local_30;
  local_10 = local_124;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             (cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),(double *)0x611e67);
  tolerances((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x611e91);
  local_188 = Tolerances::floatingPointFeastol(peVar6);
  tVar1 = boost::multiprecision::operator<
                    ((double *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x611ecb);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x611ee1);
  if (tVar1) {
    tolerances((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x611f1b);
    dVar9 = boost::multiprecision::number::operator_cast_to_double
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x611f30);
    Tolerances::setFloatingPointFeastol(peVar6,dVar9);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x611f60);
  }
  tolerances((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x611fd8);
  local_1c0 = Tolerances::floatingPointOpttol(peVar6);
  tVar1 = boost::multiprecision::operator<
                    ((double *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x612012);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x612028);
  if (tVar1) {
    tolerances((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x612062);
    dVar9 = boost::multiprecision::number::operator_cast_to_double
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x612077);
    Tolerances::setFloatingPointOpttol(peVar6,dVar9);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x6120a7);
  }
  iVar2 = intParam(in_RDI,REPRESENTATION);
  if (iVar2 == 1) {
LAB_0061219e:
    RVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::rep(&in_RDI->_solver);
    if (RVar4 == COLUMN) goto LAB_006121d5;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setRep((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             in_stack_fffffffffffffabc);
  }
  else {
    iVar2 = intParam(in_RDI,REPRESENTATION);
    if (iVar2 == 0) {
      iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x61213f);
      RVar7 = realParam(in_RDI,REPRESENTATION_SWITCH);
      iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x612188);
      if ((double)(iVar3 + 1) <= (double)(iVar2 + 1) * RVar7) goto LAB_0061219e;
    }
LAB_006121d5:
    iVar2 = intParam(in_RDI,REPRESENTATION);
    if (iVar2 == 2) {
LAB_00612278:
      RVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rep(&in_RDI->_solver);
      if (RVar4 != ROW) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setRep((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                 in_stack_fffffffffffffabc);
      }
    }
    else {
      iVar2 = intParam(in_RDI,REPRESENTATION);
      if (iVar2 == 0) {
        iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x61221f);
        RVar7 = realParam(in_RDI,REPRESENTATION_SWITCH);
        iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x612265);
        if ((double)(iVar2 + 1) * RVar7 < (double)(iVar3 + 1)) goto LAB_00612278;
      }
    }
  }
  iVar2 = intParam(in_RDI,ALGORITHM);
  if ((((iVar2 == 0) &&
       (RVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rep(&in_RDI->_solver), RVar4 == COLUMN)) ||
      ((iVar2 = intParam(in_RDI,ALGORITHM), iVar2 == 1 &&
       (RVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rep(&in_RDI->_solver), RVar4 == ROW)))) &&
     (TVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::type(&in_RDI->_solver), TVar5 != ENTER)) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setType(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
  }
  else {
    iVar2 = intParam(in_RDI,ALGORITHM);
    if ((((iVar2 == 1) &&
         (RVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rep(&in_RDI->_solver), RVar4 == COLUMN)) ||
        ((iVar2 = intParam(in_RDI,ALGORITHM), iVar2 == 0 &&
         (RVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rep(&in_RDI->_solver), RVar4 == ROW)))) &&
       (TVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::type(&in_RDI->_solver), TVar5 != LEAVE)) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setType(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    }
  }
  local_238 = realParam(in_RDI,SPARSITY_THRESHOLD);
  local_b0 = local_230;
  local_b8 = &local_238;
  local_c0 = 0;
  local_48 = local_b8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffad0,
             (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             (type *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setSparsePricingFactor
            ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  iVar2 = intParam(in_RDI,HYPER_PRICING);
  if (iVar2 == 2) {
LAB_006124d4:
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::hyperPricing(in_stack_fffffffffffffad0,SUB41((uint)in_stack_fffffffffffffacc >> 0x18,0));
  }
  else {
    iVar2 = intParam(in_RDI,HYPER_PRICING);
    if (iVar2 == 1) {
      iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x6124ad);
      iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x6124c5);
      if (5000 < iVar2 + iVar3) goto LAB_006124d4;
    }
    iVar2 = intParam(in_RDI,HYPER_PRICING);
    if (iVar2 == 0) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::hyperPricing(in_stack_fffffffffffffad0,SUB41((uint)in_stack_fffffffffffffacc >> 0x18,0));
    }
  }
  local_290 = realParam(in_RDI,REFAC_BASIS_NNZ);
  local_98 = local_288;
  local_a0 = &local_290;
  local_a8 = 0;
  local_50 = local_a0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffad0,
             (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             (type *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setNonzeroFactor((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  local_2e8 = realParam(in_RDI,REFAC_UPDATE_FILL);
  local_80 = local_2e0;
  local_88 = &local_2e8;
  local_90 = 0;
  local_58 = local_88;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffad0,
             (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             (type *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setFillFactor((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  local_340 = realParam(in_RDI,REFAC_MEM_FACTOR);
  local_68 = local_338;
  local_70 = &local_340;
  local_78 = 0;
  local_60 = local_70;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffad0,
             (double)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
             (type *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMemFactor((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  (*in_RDI->_statistics->simplexTime->_vptr_Timer[3])();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solve(in_stack_00002908,in_stack_00002900,(bool)in_stack_000028ff);
  (*in_RDI->_statistics->simplexTime->_vptr_Timer[4])();
  iVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x6129a1);
  if (0 < iVar2) {
    SLUFactorRational::clear
              ((SLUFactorRational *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  }
  iVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x6129dc);
  in_RDI->_statistics->iterations = iVar2 + in_RDI->_statistics->iterations;
  iVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::primalIterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  in_RDI->_statistics->iterationsPrimal = iVar2 + in_RDI->_statistics->iterationsPrimal;
  if ((local_d1 & 1) == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x612a3a);
  }
  in_RDI->_statistics->iterationsFromBasis = iVar2 + in_RDI->_statistics->iterationsFromBasis;
  iVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::polishIterations(&in_RDI->_solver);
  in_RDI->_statistics->iterationsPolish = iVar3 + in_RDI->_statistics->iterationsPolish;
  iVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::boundFlips(&in_RDI->_solver);
  in_RDI->_statistics->boundflips = iVar3 + in_RDI->_statistics->boundflips;
  (*((in_RDI->_solver).multTimeSparse)->_vptr_Timer[6])();
  in_RDI->_statistics->multTimeSparse = extraout_XMM0_Qa_00 + in_RDI->_statistics->multTimeSparse;
  (*((in_RDI->_solver).multTimeFull)->_vptr_Timer[6])();
  in_RDI->_statistics->multTimeFull = extraout_XMM0_Qa_01 + in_RDI->_statistics->multTimeFull;
  (*((in_RDI->_solver).multTimeColwise)->_vptr_Timer[6])();
  in_RDI->_statistics->multTimeColwise = extraout_XMM0_Qa_02 + in_RDI->_statistics->multTimeColwise;
  (*((in_RDI->_solver).multTimeUnsetup)->_vptr_Timer[6])();
  in_RDI->_statistics->multTimeUnsetup = extraout_XMM0_Qa_03 + in_RDI->_statistics->multTimeUnsetup;
  in_RDI->_statistics->multSparseCalls =
       (in_RDI->_solver).multSparseCalls + in_RDI->_statistics->multSparseCalls;
  in_RDI->_statistics->multFullCalls =
       (in_RDI->_solver).multFullCalls + in_RDI->_statistics->multFullCalls;
  in_RDI->_statistics->multColwiseCalls =
       (in_RDI->_solver).multColwiseCalls + in_RDI->_statistics->multColwiseCalls;
  in_RDI->_statistics->multUnsetupCalls =
       (in_RDI->_solver).multUnsetupCalls + in_RDI->_statistics->multUnsetupCalls;
  RVar7 = SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getFactorTime((SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x612ba0);
  in_RDI->_statistics->luFactorizationTimeReal =
       RVar7 + in_RDI->_statistics->luFactorizationTimeReal;
  RVar7 = SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getSolveTime((SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x612bc8);
  in_RDI->_statistics->luSolveTimeReal = RVar7 + in_RDI->_statistics->luSolveTimeReal;
  iVar3 = SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getFactorCount(&in_RDI->_slufactor);
  in_RDI->_statistics->luFactorizationsReal = iVar3 + in_RDI->_statistics->luFactorizationsReal;
  iVar3 = SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getSolveCount(&in_RDI->_slufactor);
  in_RDI->_statistics->luSolvesReal = iVar3 + in_RDI->_statistics->luSolvesReal;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::resetCounters((SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(iVar2,in_stack_fffffffffffffac0));
  iVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::primalDegeneratePivots
                    ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(iVar2,in_stack_fffffffffffffac0));
  in_RDI->_statistics->degenPivotsPrimal = iVar3 + in_RDI->_statistics->degenPivotsPrimal;
  iVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::dualDegeneratePivots
                    ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(iVar2,in_stack_fffffffffffffac0));
  in_RDI->_statistics->degenPivotsDual = iVar2 + in_RDI->_statistics->degenPivotsDual;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::sumDualDegeneracy((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator+=(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::sumPrimalDegeneracy
            ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator+=(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  return;
}

Assistant:

void SoPlexBase<R>::_solveRealLPAndRecordStatistics(volatile bool* interrupt)
{
   bool _hadBasis = _hasBasis;

   // set time and iteration limit
   if(intParam(SoPlexBase<R>::ITERLIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationIter(intParam(SoPlexBase<R>::ITERLIMIT) - _statistics->iterations);
   else
      _solver.setTerminationIter(-1);

   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                 _statistics->solvingTime->time());
   else
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::INFTY)));

   // ensure that tolerances are not too small
   R mintol = 1e4 * _solver.epsilon();

   if(this->tolerances()->floatingPointFeastol() < mintol)
      this->tolerances()->setFloatingPointFeastol(Real(mintol));

   if(this->tolerances()->floatingPointOpttol() < mintol)
      this->tolerances()->setFloatingPointOpttol(Real(mintol));

   // set correct representation
   if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_COLUMN
         || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
             && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) >=
             (_solver.nRows() + 1)))
         && _solver.rep() != SPxSolverBase<R>::COLUMN)
   {
      _solver.setRep(SPxSolverBase<R>::COLUMN);
   }
   else if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
           && _solver.rep() != SPxSolverBase<R>::ROW)
   {
      _solver.setRep(SPxSolverBase<R>::ROW);
   }

   // set correct type
   if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
         && _solver.rep() == SPxSolverBase<R>::COLUMN)
         || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL && _solver.rep() == SPxSolverBase<R>::ROW))
         && _solver.type() != SPxSolverBase<R>::ENTER)
   {
      _solver.setType(SPxSolverBase<R>::ENTER);
   }
   else if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL
             && _solver.rep() == SPxSolverBase<R>::COLUMN)
            || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
                && _solver.rep() == SPxSolverBase<R>::ROW))
           && _solver.type() != SPxSolverBase<R>::LEAVE)
   {
      _solver.setType(SPxSolverBase<R>::LEAVE);
   }

   // set pricing modes
   _solver.setSparsePricingFactor(realParam(SoPlexBase<R>::SPARSITY_THRESHOLD));

   if((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_ON)
         || ((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_AUTO)
             && (_solver.nRows() + _solver.nCols() > SOPLEX_HYPERPRICINGTHRESHOLD)))
      _solver.hyperPricing(true);
   else if(intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_OFF)
      _solver.hyperPricing(false);

   _solver.setNonzeroFactor(realParam(SoPlexBase<R>::REFAC_BASIS_NNZ));
   _solver.setFillFactor(realParam(SoPlexBase<R>::REFAC_UPDATE_FILL));
   _solver.setMemFactor(realParam(SoPlexBase<R>::REFAC_MEM_FACTOR));

   // call floating-point solver and catch exceptions
   _statistics->simplexTime->start();

   try
   {
      _solver.solve(interrupt);
   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() << "> while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught unknown exception while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }

   _statistics->simplexTime->stop();

   // invalidate rational factorization of basis if pivots have been performed
   if(_solver.iterations() > 0)
      _rationalLUSolver.clear();

   // record statistics
   _statistics->iterations += _solver.iterations();
   _statistics->iterationsPrimal += _solver.primalIterations();
   _statistics->iterationsFromBasis += _hadBasis ? _solver.iterations() : 0;
   _statistics->iterationsPolish += _solver.polishIterations();
   _statistics->boundflips += _solver.boundFlips();
   _statistics->multTimeSparse += _solver.multTimeSparse->time();
   _statistics->multTimeFull += _solver.multTimeFull->time();
   _statistics->multTimeColwise += _solver.multTimeColwise->time();
   _statistics->multTimeUnsetup += _solver.multTimeUnsetup->time();
   _statistics->multSparseCalls += _solver.multSparseCalls;
   _statistics->multFullCalls += _solver.multFullCalls;
   _statistics->multColwiseCalls += _solver.multColwiseCalls;
   _statistics->multUnsetupCalls += _solver.multUnsetupCalls;
   _statistics->luFactorizationTimeReal += _slufactor.getFactorTime();
   _statistics->luSolveTimeReal += _slufactor.getSolveTime();
   _statistics->luFactorizationsReal += _slufactor.getFactorCount();
   _statistics->luSolvesReal += _slufactor.getSolveCount();
   _slufactor.resetCounters();

   _statistics->degenPivotsPrimal += _solver.primalDegeneratePivots();
   _statistics->degenPivotsDual += _solver.dualDegeneratePivots();
   _statistics->sumDualDegen += _solver.sumDualDegeneracy();
   _statistics->sumPrimalDegen += _solver.sumPrimalDegeneracy();
}